

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedCrand(word *a,word *mod,size_t n,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  word wVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  wVar3 = zzAddMulW(a,a + n,n,-*mod);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = -*mod;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = wVar3;
  uVar4 = SUB168(auVar1 * auVar2,0);
  uVar5 = uVar4 + *a;
  uVar7 = SUB168(auVar1 * auVar2,8) + (ulong)CARRY8(uVar4,*a);
  *a = uVar5;
  uVar4 = *mod;
  uVar5 = (ulong)(uVar4 <= uVar5);
  if (1 < n) {
    sVar6 = 1;
    do {
      uVar4 = a[sVar6];
      uVar8 = uVar7 + a[sVar6];
      a[sVar6] = uVar8;
      uVar7 = (ulong)CARRY8(uVar7,uVar4);
      if (mod[sVar6] != uVar8) {
        uVar5 = 0;
      }
      uVar5 = mod[sVar6] < uVar8 | uVar5;
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
    uVar4 = *mod;
  }
  zzAddW2(a,n,-uVar4 & -(uVar7 | uVar5));
  return;
}

Assistant:

void SAFE(zzRedCrand)(word a[], const word mod[], size_t n, void* stack)
{
	register word carry;
	register dword prod;
	register word mask;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	// iter1
	carry = zzAddMulW(a, a + n, n, WORD_0 - mod[0]);
	// iter2
	zzMul11(prod, carry, WORD_0 - mod[0]);
	prod += a[0];
	a[0] = (word)prod;
	prod >>= B_PER_W;
	// add and cmp
	carry = (word)prod;
	mask = wordLeq01(mod[0], a[0]);
	for (i = 1; i < n; ++i)
	{
		a[i] += carry;
		carry = wordLess01(a[i], carry);
		// mask <-  mod[i] < a[i] | mask & mod[i] == a[i];
		mask &= wordEq01(mod[i], a[i]);
		mask |= wordLess01(mod[i], a[i]);
	}
	// correct
	mask |= carry;
	mask = WORD_0 - mask;
	mask &= (WORD_0 - mod[0]);
	zzAddW2(a, n, mask);
	// очистка
	prod = 0;
	carry = mask = 0;
}